

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations2Points1Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *P1,Matrix<float,_4,_1,_0,_4,_1> *P2
          ,Matrix<float,_4,_1,_0,_4,_1> *P1_B,Matrix<float,_4,_1,_0,_4,_1> *P2_B)

{
  iterator iVar1;
  Index inner;
  undefined8 *puVar2;
  _Nested n;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  RealScalar z_1;
  float fVar8;
  float fVar9;
  RealScalar z;
  float fVar10;
  Matrix<float,_3,_1,_0,_3,_1> v3;
  Matrix<float,_4,_4,_0,_4,_4> TP_B;
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Matrix<float,_4,_4,_0,_4,_4> transU_B;
  Matrix<float,_4,_4,_0,_4,_4> transU;
  Matrix<float,_4,_4,_0,_4,_4> transV_B;
  Matrix<float,_4,_4,_0,_4,_4> transV;
  Matrix<float,_4,_1,_0,_4,_1> P2_B1;
  Matrix<float,_4,_1,_0,_4,_1> P2_1;
  Matrix<float,_3,_1,_0,_3,_1> local_1f8;
  Matrix<float,_3,_1,_0,_3,_1> local_1ec;
  Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_1e0;
  Matrix<float,_4,_4,_0,_4,_4> local_1d8;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128 [4];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8 [4];
  undefined8 local_d8;
  float afStack_d0 [14];
  undefined8 local_98;
  float afStack_90 [15];
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  puVar2 = &local_118;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  lVar3 = 0;
  do {
    *(undefined4 *)puVar2 = 0x3f800000;
    lVar3 = lVar3 + 0x10;
    puVar2 = (undefined8 *)((long)puVar2 + 0x14);
  } while (lVar3 != 0x40);
  lVar3 = 0;
  do {
    local_e8[lVar3] =
         -(P1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  puVar2 = &local_158;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  local_128[3] = 0.0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  lVar3 = 0;
  do {
    *(undefined4 *)puVar2 = 0x3f800000;
    lVar3 = lVar3 + 0x10;
    puVar2 = (undefined8 *)((long)puVar2 + 0x14);
  } while (lVar3 != 0x40);
  lVar3 = 0;
  do {
    local_128[lVar3] =
         -(P1_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  fVar4 = (P2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (P2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (P2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  fVar7 = (P2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  local_48 = fVar7 * local_e8[0] +
             fVar6 * (float)local_f8 + fVar5 * (float)local_108 + fVar4 * (float)local_118;
  fStack_44 = fVar7 * local_e8[1] +
              fVar6 * local_f8._4_4_ + fVar5 * local_108._4_4_ + fVar4 * local_118._4_4_;
  fStack_40 = fVar7 * local_e8[2] +
              fVar6 * (float)uStack_f0 + fVar5 * (float)uStack_100 + fVar4 * (float)uStack_110;
  fStack_3c = fVar7 * local_e8[3] +
              fVar6 * uStack_f0._4_4_ + fVar5 * uStack_100._4_4_ + fVar4 * uStack_110._4_4_;
  fVar4 = (P2_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (P2_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (P2_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  fVar7 = (P2_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  afStack_90[0xe] =
       fVar7 * local_128[0] +
       fVar6 * (float)local_138 + fVar5 * (float)local_148 + fVar4 * (float)local_158;
  fStack_54 = fVar7 * local_128[1] +
              fVar6 * local_138._4_4_ + fVar5 * local_148._4_4_ + fVar4 * local_158._4_4_;
  fStack_50 = fVar7 * local_128[2] +
              fVar6 * (float)uStack_130 + fVar5 * (float)uStack_140 + fVar4 * (float)uStack_150;
  fStack_4c = fVar7 * local_128[3] +
              fVar6 * uStack_130._4_4_ + fVar5 * uStack_140._4_4_ + fVar4 * uStack_150._4_4_;
  puVar2 = &local_98;
  local_98 = 0;
  afStack_90[0] = 0.0;
  afStack_90[1] = 0.0;
  afStack_90[2] = 0.0;
  afStack_90[3] = 0.0;
  afStack_90[4] = 0.0;
  afStack_90[5] = 0.0;
  afStack_90[6] = 0.0;
  afStack_90[7] = 0.0;
  afStack_90[8] = 0.0;
  afStack_90[9] = 0.0;
  afStack_90[10] = 0.0;
  afStack_90[0xb] = 0.0;
  afStack_90[0xc] = 0.0;
  afStack_90[0xd] = 0.0;
  lVar3 = 0;
  do {
    *(undefined4 *)puVar2 = 0x3f800000;
    lVar3 = lVar3 + 0x10;
    puVar2 = (undefined8 *)((long)puVar2 + 0x14);
  } while (lVar3 != 0x40);
  puVar2 = &local_d8;
  afStack_d0[10] = 0.0;
  afStack_d0[0xb] = 0.0;
  afStack_d0[0xc] = 0.0;
  afStack_d0[0xd] = 0.0;
  afStack_d0[6] = 0.0;
  afStack_d0[7] = 0.0;
  afStack_d0[8] = 0.0;
  afStack_d0[9] = 0.0;
  afStack_d0[2] = 0.0;
  afStack_d0[3] = 0.0;
  afStack_d0[4] = 0.0;
  afStack_d0[5] = 0.0;
  local_d8 = 0;
  afStack_d0[0] = 0.0;
  afStack_d0[1] = 0.0;
  lVar3 = 0;
  do {
    *(undefined4 *)puVar2 = 0x3f800000;
    lVar3 = lVar3 + 0x10;
    puVar2 = (undefined8 *)((long)puVar2 + 0x14);
  } while (lVar3 != 0x40);
  local_198 = (undefined1  [8])&local_48;
  uStack_190 = 3;
  local_178 = 0;
  local_168 = 4;
  uStack_180 = (float *)local_198;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            ((PlainObject *)&local_1d8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             local_198);
  if (CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[5],
               local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[4]) != 3) {
LAB_0014de53:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<float, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, 3, 1>]"
                 );
  }
  local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  fVar4 = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] * 0.0 +
          local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1] * -0.0;
  local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1] * 0.0 -
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0] * 0.0;
  fVar6 = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] -
          local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2];
  fVar5 = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1] -
          local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0];
  local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1] * -0.0 +
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2] * -0.0 +
       local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  fVar8 = fVar5 * fVar5 + fVar6 * fVar6 + fVar4 * fVar4;
  fVar7 = SQRT(fVar8);
  fVar10 = local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] *
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] +
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] *
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] +
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] *
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
  fVar9 = SQRT(fVar10);
  if (fVar9 <= fVar7) {
    local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = fVar4;
    local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = fVar5;
    local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = fVar6;
    if (0.0 < fVar8) {
      local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = fVar4 / fVar7;
      local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = fVar6 / fVar7;
      local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = fVar5 / fVar7;
    }
  }
  else if (0.0 < fVar10) {
    local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] / fVar9;
    local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] / fVar9;
    local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] / fVar9;
  }
  uStack_190 = 1;
  local_188 = 3;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 4;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = &local_1f8;
  local_198 = (undefined1  [8])&local_98;
  uStack_180 = (float *)&local_98;
  Eigen::internal::
  check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_198,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_1d8);
  if ((uStack_190 == 1) && (local_188 == 3)) {
    lVar3 = 0;
    do {
      *(float *)local_198 =
           (((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array._0_8_)->m_storage).m_data.array[lVar3];
      lVar3 = lVar3 + 1;
      local_198 = (undefined1  [8])((long)local_198 + 0x10);
    } while (lVar3 != 3);
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] *
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] -
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] *
           local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] *
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] -
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] *
           local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] *
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] -
           local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] *
           local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
    local_198 = (undefined1  [8])((long)&local_98 + 4);
    uStack_190 = 1;
    local_188 = 3;
    local_178 = 1;
    uStack_170 = 0;
    local_168 = 4;
    local_1e0.m_matrix = (non_const_type)&local_1d8;
    uStack_180 = (float *)&local_98;
    Eigen::internal::
    check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
              ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_198,&local_1e0);
    if ((uStack_190 == 1) && (local_188 == 3)) {
      lVar3 = 0;
      do {
        *(float *)local_198 =
             *(float *)((long)(((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                               &(local_1e0.m_matrix)->
                                super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)->
                              m_storage).m_data.array + lVar3 * 4);
        lVar3 = lVar3 + 1;
        local_198 = (undefined1  [8])((long)local_198 + 0x10);
      } while (lVar3 != 3);
      local_198 = (undefined1  [8])afStack_90;
      uStack_190 = 1;
      local_188 = 3;
      local_178 = 2;
      uStack_170 = 0;
      local_168 = 4;
      local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
      _0_8_ = &local_1ec;
      uStack_180 = (float *)&local_98;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_198,
                 (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_1d8);
      if ((uStack_190 == 1) && (local_188 == 3)) {
        lVar3 = 0;
        do {
          *(float *)local_198 =
               (((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array._0_8_)->m_storage).m_data.array[lVar3];
          lVar3 = lVar3 + 1;
          local_198 = (undefined1  [8])((long)local_198 + 0x10);
        } while (lVar3 != 3);
        local_198 = (undefined1  [8])(afStack_90 + 0xe);
        uStack_190 = 3;
        local_178 = 0;
        local_168 = 4;
        uStack_180 = (float *)local_198;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
        normalized((PlainObject *)&local_1d8,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                   local_198);
        if (CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array[5],
                     local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array[4]) != 3) goto LAB_0014de53;
        local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0];
        local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1];
        local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2];
        fVar4 = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2] * 0.0 +
                local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] * -0.0;
        local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1] * 0.0 -
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0];
        local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0] * 0.0;
        fVar6 = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] -
                local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2];
        fVar5 = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] -
                local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0];
        local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1] * -0.0 +
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2];
        local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2] * -0.0 +
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0];
        fVar8 = fVar5 * fVar5 + fVar6 * fVar6 + fVar4 * fVar4;
        fVar7 = SQRT(fVar8);
        fVar10 = local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] *
                 local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] +
                 local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] *
                 local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] +
                 local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] *
                 local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
        fVar9 = SQRT(fVar10);
        if (fVar9 <= fVar7) {
          local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = fVar4;
          local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = fVar5;
          local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = fVar6;
          if (0.0 < fVar8) {
            local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = fVar4 / fVar7;
            local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = fVar6 / fVar7;
            local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = fVar5 / fVar7;
          }
        }
        else if (0.0 < fVar10) {
          local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] / fVar9;
          local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] / fVar9;
          local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] / fVar9;
        }
        uStack_190 = 1;
        local_188 = 3;
        local_178 = 0;
        uStack_170 = 0;
        local_168 = 4;
        local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        ._0_8_ = &local_1f8;
        local_198 = (undefined1  [8])&local_d8;
        uStack_180 = (float *)&local_d8;
        Eigen::internal::
        check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                  ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_198,
                   (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_1d8);
        if ((uStack_190 == 1) && (local_188 == 3)) {
          lVar3 = 0;
          do {
            *(float *)local_198 =
                 (((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                  local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array._0_8_)->m_storage).m_data.array[lVar3];
            lVar3 = lVar3 + 1;
            local_198 = (undefined1  [8])((long)local_198 + 0x10);
          } while (lVar3 != 3);
          local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] = local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] *
                     local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] -
                     local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] *
                     local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1];
          local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1] = local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] *
                     local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] -
                     local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] *
                     local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0];
          local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] *
                     local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] -
                     local_1f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] *
                     local_1ec.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2];
          local_198 = (undefined1  [8])((long)&local_d8 + 4);
          uStack_190 = 1;
          local_188 = 3;
          local_178 = 1;
          uStack_170 = 0;
          local_168 = 4;
          local_1e0.m_matrix = (non_const_type)&local_1d8;
          uStack_180 = (float *)&local_d8;
          Eigen::internal::
          check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                    ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_198,
                     &local_1e0);
          if ((uStack_190 == 1) && (local_188 == 3)) {
            lVar3 = 0;
            do {
              *(float *)local_198 =
                   *(float *)((long)(((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                     &(local_1e0.m_matrix)->
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)->
                                    m_storage).m_data.array + lVar3 * 4);
              lVar3 = lVar3 + 1;
              local_198 = (undefined1  [8])((long)local_198 + 0x10);
            } while (lVar3 != 3);
            local_198 = (undefined1  [8])afStack_d0;
            uStack_190 = 1;
            local_188 = 3;
            local_178 = 2;
            uStack_170 = 0;
            local_168 = 4;
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array._0_8_ = &local_1ec;
            uStack_180 = (float *)&local_d8;
            Eigen::internal::
            check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                      ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_198,
                       (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_1d8);
            if ((uStack_190 == 1) && (local_188 == 3)) {
              lVar3 = 0;
              do {
                *(float *)local_198 =
                     (((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                      local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array._0_8_)->m_storage).m_data.array[lVar3];
                lVar3 = lVar3 + 1;
                local_198 = (undefined1  [8])((long)local_198 + 0x10);
              } while (lVar3 != 3);
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              fStack_160 = local_e8[3] * afStack_90[0xc] +
                           local_e8[2] * afStack_90[8] +
                           local_e8[1] * afStack_90[4] + local_e8[0] * afStack_90[0];
              fStack_15c = local_e8[3] * afStack_90[0xd] +
                           local_e8[2] * afStack_90[9] +
                           local_e8[1] * afStack_90[5] + local_e8[0] * afStack_90[1];
              local_198._4_4_ =
                   uStack_110._4_4_ * afStack_90[0xb] +
                   (float)uStack_110 * afStack_90[7] +
                   local_118._4_4_ * afStack_90[3] + (float)local_118 * local_98._4_4_;
              local_198._0_4_ =
                   uStack_110._4_4_ * afStack_90[10] +
                   (float)uStack_110 * afStack_90[6] +
                   local_118._4_4_ * afStack_90[2] + (float)local_118 * (float)local_98;
              uStack_190._4_4_ =
                   uStack_110._4_4_ * afStack_90[0xd] +
                   (float)uStack_110 * afStack_90[9] +
                   local_118._4_4_ * afStack_90[5] + (float)local_118 * afStack_90[1];
              uStack_190._0_4_ =
                   uStack_110._4_4_ * afStack_90[0xc] +
                   (float)uStack_110 * afStack_90[8] +
                   local_118._4_4_ * afStack_90[4] + (float)local_118 * afStack_90[0];
              local_188._4_4_ =
                   uStack_100._4_4_ * afStack_90[0xb] +
                   (float)uStack_100 * afStack_90[7] +
                   local_108._4_4_ * afStack_90[3] + (float)local_108 * local_98._4_4_;
              local_188._0_4_ =
                   uStack_100._4_4_ * afStack_90[10] +
                   (float)uStack_100 * afStack_90[6] +
                   local_108._4_4_ * afStack_90[2] + (float)local_108 * (float)local_98;
              uStack_180 = (float *)CONCAT44(uStack_100._4_4_ * afStack_90[0xd] +
                                             (float)uStack_100 * afStack_90[9] +
                                             local_108._4_4_ * afStack_90[5] +
                                             (float)local_108 * afStack_90[1],
                                             uStack_100._4_4_ * afStack_90[0xc] +
                                             (float)uStack_100 * afStack_90[8] +
                                             local_108._4_4_ * afStack_90[4] +
                                             (float)local_108 * afStack_90[0]);
              local_178._4_4_ =
                   uStack_f0._4_4_ * afStack_90[0xb] +
                   (float)uStack_f0 * afStack_90[7] +
                   local_f8._4_4_ * afStack_90[3] + (float)local_f8 * local_98._4_4_;
              local_178._0_4_ =
                   uStack_f0._4_4_ * afStack_90[10] +
                   (float)uStack_f0 * afStack_90[6] +
                   local_f8._4_4_ * afStack_90[2] + (float)local_f8 * (float)local_98;
              uStack_170._4_4_ =
                   uStack_f0._4_4_ * afStack_90[0xd] +
                   (float)uStack_f0 * afStack_90[9] +
                   local_f8._4_4_ * afStack_90[5] + (float)local_f8 * afStack_90[1];
              uStack_170._0_4_ =
                   uStack_f0._4_4_ * afStack_90[0xc] +
                   (float)uStack_f0 * afStack_90[8] +
                   local_f8._4_4_ * afStack_90[4] + (float)local_f8 * afStack_90[0];
              local_168 = CONCAT44(local_e8[3] * afStack_90[0xb] +
                                   local_e8[2] * afStack_90[7] +
                                   local_e8[1] * afStack_90[3] + local_e8[0] * local_98._4_4_,
                                   local_e8[3] * afStack_90[10] +
                                   local_e8[2] * afStack_90[6] +
                                   local_e8[1] * afStack_90[2] + local_e8[0] * (float)local_98);
              iVar1._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar1._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                          ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                            *)__return_storage_ptr__,iVar1,(Matrix<float,_4,_4,_0,_4,_4> *)local_198
                          );
              }
              else {
                *(Index *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 0xc) = local_168;
                *(ulong *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 0xe) = CONCAT44(fStack_15c,fStack_160);
                *(long *)(((iVar1._M_current)->
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                          m_data.array + 8) = local_178;
                *(long *)(((iVar1._M_current)->
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                          m_data.array + 10) = uStack_170;
                *(long *)(((iVar1._M_current)->
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                          m_data.array + 4) = local_188;
                *(float **)
                 (((iVar1._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                  m_storage.m_data.array + 6) = uStack_180;
                *(undefined1 (*) [8])
                 ((iVar1._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                 m_storage.m_data.array = local_198;
                *(long *)(((iVar1._M_current)->
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                          m_data.array + 2) = uStack_190;
                (__return_storage_ptr__->
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
              }
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2] = uStack_150._4_4_ * afStack_d0[0xc] +
                          (float)uStack_150 * afStack_d0[8] +
                          local_158._4_4_ * afStack_d0[4] + (float)local_158 * afStack_d0[0];
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[3] = uStack_150._4_4_ * afStack_d0[0xd] +
                          (float)uStack_150 * afStack_d0[9] +
                          local_158._4_4_ * afStack_d0[5] + (float)local_158 * afStack_d0[1];
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[4] = uStack_140._4_4_ * afStack_d0[10] +
                          (float)uStack_140 * afStack_d0[6] +
                          local_148._4_4_ * afStack_d0[2] + (float)local_148 * (float)local_d8;
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[5] = uStack_140._4_4_ * afStack_d0[0xb] +
                          (float)uStack_140 * afStack_d0[7] +
                          local_148._4_4_ * afStack_d0[3] + (float)local_148 * local_d8._4_4_;
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[6] = uStack_140._4_4_ * afStack_d0[0xc] +
                          (float)uStack_140 * afStack_d0[8] +
                          local_148._4_4_ * afStack_d0[4] + (float)local_148 * afStack_d0[0];
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[7] = uStack_140._4_4_ * afStack_d0[0xd] +
                          (float)uStack_140 * afStack_d0[9] +
                          local_148._4_4_ * afStack_d0[5] + (float)local_148 * afStack_d0[1];
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[8] = uStack_130._4_4_ * afStack_d0[10] +
                          (float)uStack_130 * afStack_d0[6] +
                          local_138._4_4_ * afStack_d0[2] + (float)local_138 * (float)local_d8;
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[9] = uStack_130._4_4_ * afStack_d0[0xb] +
                          (float)uStack_130 * afStack_d0[7] +
                          local_138._4_4_ * afStack_d0[3] + (float)local_138 * local_d8._4_4_;
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[10] = uStack_130._4_4_ * afStack_d0[0xc] +
                           (float)uStack_130 * afStack_d0[8] +
                           local_138._4_4_ * afStack_d0[4] + (float)local_138 * afStack_d0[0];
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xb] = uStack_130._4_4_ * afStack_d0[0xd] +
                            (float)uStack_130 * afStack_d0[9] +
                            local_138._4_4_ * afStack_d0[5] + (float)local_138 * afStack_d0[1];
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xc] = local_128[3] * afStack_d0[10] +
                            local_128[2] * afStack_d0[6] +
                            local_128[1] * afStack_d0[2] + local_128[0] * (float)local_d8;
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xd] = local_128[3] * afStack_d0[0xb] +
                            local_128[2] * afStack_d0[7] +
                            local_128[1] * afStack_d0[3] + local_128[0] * local_d8._4_4_;
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xe] = local_128[3] * afStack_d0[0xc] +
                            local_128[2] * afStack_d0[8] +
                            local_128[1] * afStack_d0[4] + local_128[0] * afStack_d0[0];
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xf] = local_128[3] * afStack_d0[0xd] +
                            local_128[2] * afStack_d0[9] +
                            local_128[1] * afStack_d0[5] + local_128[0] * afStack_d0[1];
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1] = uStack_150._4_4_ * afStack_d0[0xb] +
                          (float)uStack_150 * afStack_d0[7] +
                          local_158._4_4_ * afStack_d0[3] + (float)local_158 * local_d8._4_4_;
              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0] = uStack_150._4_4_ * afStack_d0[10] +
                          (float)uStack_150 * afStack_d0[6] +
                          local_158._4_4_ * afStack_d0[2] + (float)local_158 * (float)local_d8;
              iVar1._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar1._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                          ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                            *)__return_storage_ptr__,iVar1,&local_1d8);
              }
              else {
                *(ulong *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 0xc) =
                     CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[0xd],
                              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[0xc]);
                *(ulong *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 0xe) =
                     CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[0xf],
                              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[0xe]);
                *(ulong *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 8) =
                     CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[9],
                              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[8]);
                *(ulong *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 10) =
                     CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[0xb],
                              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[10]);
                *(ulong *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 4) =
                     CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[5],
                              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[4]);
                *(ulong *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 6) =
                     CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[7],
                              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[6]);
                *(undefined8 *)
                 ((iVar1._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                 m_storage.m_data.array =
                     local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array._0_8_;
                *(ulong *)(((iVar1._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 2) =
                     CONCAT44(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[3],
                              local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array[2]);
                (__return_storage_ptr__->
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
              }
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 4, 4>>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations2Points1Line(Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P2, Matrix<floatPrec, 4,1> P1_B, Matrix<floatPrec, 4,1> P2_B)
{

	// translate frames to P1 and P1_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> P2_1, P2_B1;
	P2_1 = transU * P2;
	P2_B1 = transU_B * P2_B;

	// align Z axis to the direction of P1 -> P2
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = P2_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = P2_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}